

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O0

ParseResults __thiscall
bubbleJson::BubbleJson::ParseObject(BubbleJson *this,BubbleValue *bubbleValue)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *this_00;
  pointer ppVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_bool>
  pVar6;
  _Self local_b8;
  _Self local_b0;
  iterator it;
  undefined1 local_98 [8];
  BubbleValue valueTmp;
  allocator local_69;
  string local_68 [8];
  string string;
  ulong local_48;
  size_t length;
  char *c_str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *members;
  BubbleContext *pBStack_28;
  ParseResults result;
  BubbleContext *c;
  BubbleValue *bubbleValue_local;
  BubbleJson *this_local;
  
  pBStack_28 = this->context;
  c = (BubbleContext *)bubbleValue;
  bubbleValue_local = (BubbleValue *)this;
  Expect(this,'{');
  ParseWhitespace(this);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
             *)operator_new(0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  ::map(this_00);
  c->json = (char *)this_00;
  c_str = (char *)this_00;
  if (*pBStack_28->json == '}') {
    *(undefined4 *)&c->size = 6;
    pBStack_28->json = pBStack_28->json + 1;
    this_local._4_4_ = ParseResult_Ok;
  }
  else {
    do {
      if (*pBStack_28->json != '\"') {
        members._4_4_ = ParseResult_MissKey;
        goto LAB_0011d67d;
      }
      members._4_4_ = ParseStringRaw(this,(char **)&length,&local_48);
      sVar2 = length;
      uVar1 = local_48;
      if (members._4_4_ != ParseResult_Ok) goto LAB_0011d67d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,(char *)sVar2,uVar1,&local_69);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      ParseWhitespace(this);
      if (*pBStack_28->json == ':') {
        pBStack_28->json = pBStack_28->json + 1;
        ParseWhitespace(this);
        BubbleValue::BubbleValue((BubbleValue *)local_98);
        members._4_4_ = ParseValue(this,(BubbleValue *)local_98);
        if (members._4_4_ == ParseResult_Ok) {
          pVar6 = std::
                  map<std::__cxx11::string,bubbleJson::BubbleValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
                  ::emplace<std::__cxx11::string&,bubbleJson::BubbleValue&>
                            ((map<std::__cxx11::string,bubbleJson::BubbleValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
                              *)c_str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_68,(BubbleValue *)local_98);
          it._M_node = (_Base_ptr)pVar6.first._M_node;
          ParseWhitespace(this);
          if (*pBStack_28->json == ',') {
            pBStack_28->json = pBStack_28->json + 1;
            ParseWhitespace(this);
            valueTmp.type = ValueType_Null;
          }
          else if (*pBStack_28->json == '}') {
            pBStack_28->json = pBStack_28->json + 1;
            *(undefined4 *)&c->size = 6;
            this_local._4_4_ = ParseResult_Ok;
            valueTmp.type = ValueType_False;
          }
          else {
            members._4_4_ = ParseResult_MissCommaOrCurlyBracket;
            valueTmp.type = ValueType_Number;
          }
        }
        else {
          valueTmp.type = ValueType_Number;
        }
        BubbleValue::~BubbleValue((BubbleValue *)local_98);
      }
      else {
        members._4_4_ = ParseResult_MissColon;
        valueTmp.type = ValueType_Number;
      }
      std::__cxx11::string::~string(local_68);
    } while (valueTmp.type == ValueType_Null);
    if (valueTmp.type != ValueType_False) {
LAB_0011d67d:
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                    *)c_str);
      while( true ) {
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                    *)c_str);
        bVar4 = std::operator!=(&local_b0,&local_b8);
        pcVar3 = c_str;
        if (!bVar4) break;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
                 ::operator->(&local_b0);
        BubbleValue::MemoryFreeValue(&ppVar5->second);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>
        ::operator++(&local_b0);
      }
      if (c_str != (char *)0x0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                *)c_str);
        operator_delete(pcVar3);
      }
      c->json = (char *)0x0;
      this_local._4_4_ = members._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

ParseResults BubbleJson::ParseObject(BubbleValue *bubbleValue)
{
    BubbleContext* c = this->context;
    ParseResults result;

    Expect('{');
    ParseWhitespace();

    map<string, BubbleValue>* members = new map<string, BubbleValue>;
    bubbleValue->u.object.members = members;

    if (*c->json == '}')
    {
        bubbleValue->type = ValueType_Object;
        c->json++;
        return ParseResult_Ok;
    }
    while (true)
    {
        char* c_str;
        size_t length;

        if (*c->json != '"')
        {
            result = ParseResult_MissKey;
            break;
        }
        if ((result = ParseStringRaw(&c_str, &length)) != ParseResult_Ok)
            break;
        string string(c_str,length);

        ParseWhitespace();
        if (*c->json == ':')
        {
            c->json++;
            ParseWhitespace();
        }
        else
        {
            result = ParseResult_MissColon;
            break;
        }

        BubbleValue valueTmp;
        if ((result = ParseValue(&valueTmp)) != ParseResult_Ok)
            break;
        members->emplace(string, valueTmp);

        ParseWhitespace();
        if (*c->json == ',')
        {
            c->json++;
            ParseWhitespace();
        }
        else if (*c->json == '}')
        {
            c->json++;
            bubbleValue->type = ValueType_Object;
            return ParseResult_Ok;
        }
        else
        {
            result = ParseResult_MissCommaOrCurlyBracket;
            break;
        }
    }

    for (auto it = members->begin(); it != members->end(); ++it)
    {
        //delete (it->first);
        it->second.MemoryFreeValue();
    }
    delete members;
    bubbleValue->u.object.members = nullptr;
    return result;
}